

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_card.cc
# Opt level: O2

string * __thiscall
hanabi_learning_env::HanabiCard::ToString_abi_cxx11_
          (string *__return_storage_ptr__,HanabiCard *this)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((this->color_ < 0) || (this->rank_ < 0)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"XX",(allocator *)&local_50);
  }
  else {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
    cVar1 = ColorIndexToChar(this->color_);
    std::operator+(&local_50,&local_30,cVar1);
    cVar1 = RankIndexToChar(this->rank_);
    std::operator+(__return_storage_ptr__,&local_50,cVar1);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HanabiCard::ToString() const {
  if (!IsValid()) {
    return std::string("XX");
  }
  return std::string() + ColorIndexToChar(Color()) + RankIndexToChar(Rank());
}